

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_close_self_without_close_hook(void)

{
  cio_error cVar1;
  uint8_t data [2];
  ws_frame frames [1];
  cio_websocket my_ws;
  
  cVar1 = cio_websocket_server_init(&my_ws,on_connect,(cio_websocket_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,"Init did not succeeded",0x889,UNITY_DISPLAY_STYLE_INT);
  my_ws.ws_private.http_client = &http_client;
  frames[0].data = data;
  data[0] = 0xe8;
  data[1] = '\x03';
  frames[0].frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
  frames[0].direction = FROM_CLIENT;
  frames[0].data_length = 2;
  frames[0].last_frame = true;
  frames[0].rsv = false;
  serialize_frames(frames,1);
  cVar1 = cio_websocket_close(&my_ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,close_handler,
                              (void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x896,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_websocket_read_message(&my_ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x899,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x89b,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&my_ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x89c,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_val == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
               0x89e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was not called",0x8a0,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,
               "control callback was not called for last close frame",0x8a2,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail("context of read handler not NULL",0x89d);
}

Assistant:

static void test_close_self_without_close_hook(void)
{
	struct cio_websocket my_ws;
	enum cio_error err = cio_websocket_server_init(&my_ws, on_connect, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Init did not succeeded");

	my_ws.ws_private.http_client = &http_client;

	uint8_t data[] = {0xe8, 0x3};

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	err = cio_websocket_close(&my_ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, close_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	err = cio_websocket_read_message(&my_ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(&my_ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was not called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was not called for last close frame");
}